

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O3

int mbedtls_cipher_cmac_reset(mbedtls_cipher_context_t *ctx)

{
  mbedtls_cmac_context_t *buf;
  int iVar1;
  
  iVar1 = -0x6100;
  if (((ctx != (mbedtls_cipher_context_t *)0x0) &&
      (ctx->cipher_info != (mbedtls_cipher_info_t *)0x0)) &&
     (buf = ctx->cmac_ctx, iVar1 = -0x6100, buf != (mbedtls_cmac_context_t *)0x0)) {
    buf->unprocessed_len = 0;
    mbedtls_platform_zeroize(buf->unprocessed_block,0x10);
    mbedtls_platform_zeroize(buf,0x10);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mbedtls_cipher_cmac_reset( mbedtls_cipher_context_t *ctx )
{
    mbedtls_cmac_context_t* cmac_ctx;

    if( ctx == NULL || ctx->cipher_info == NULL || ctx->cmac_ctx == NULL )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    cmac_ctx = ctx->cmac_ctx;

    /* Reset the internal state */
    cmac_ctx->unprocessed_len = 0;
    mbedtls_platform_zeroize( cmac_ctx->unprocessed_block,
                              sizeof( cmac_ctx->unprocessed_block ) );
    mbedtls_platform_zeroize( cmac_ctx->state,
                              sizeof( cmac_ctx->state ) );

    return( 0 );
}